

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_extension_operator.cpp
# Opt level: O3

string * __thiscall
duckdb::LogicalExtensionOperator::GetExtensionName_abi_cxx11_
          (string *__return_storage_ptr__,LogicalExtensionOperator *this)

{
  SerializationException *this_00;
  string local_40;
  
  this_00 = (SerializationException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,
             "LogicalExtensionOperator::GetExtensionName not implemented which is required for serializing extension operators"
             ,"");
  SerializationException::SerializationException(this_00,&local_40);
  __cxa_throw(this_00,&SerializationException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

string LogicalExtensionOperator::GetExtensionName() const {
	throw SerializationException("LogicalExtensionOperator::GetExtensionName not implemented which is required for "
	                             "serializing extension operators");
}